

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_RepeatedFieldSmartSet_MultipleMatches_Test
::TestBody(MessageDifferencerTest_RepeatedFieldSmartSet_MultipleMatches_Test *this)

{
  bool bVar1;
  TestField *pTVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_580;
  Message local_578;
  undefined1 local_570 [8];
  AssertionResult gtest_ar;
  AssertHelper local_540;
  Message local_538;
  bool local_529;
  undefined1 local_528 [8];
  AssertionResult gtest_ar_;
  MessageDifferencer differencer;
  string diff_report;
  TestField elem3_2;
  TestField elem2_2;
  TestField elem3_1;
  TestField elem2_1;
  TestField elem1_1;
  undefined1 local_180 [8];
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencerTest_RepeatedFieldSmartSet_MultipleMatches_Test *this_local;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_180);
  proto2_unittest::TestField::TestField((TestField *)((long)&elem2_1.field_0 + 0x40));
  proto2_unittest::TestField::TestField((TestField *)((long)&elem3_1.field_0 + 0x40));
  proto2_unittest::TestField::TestField((TestField *)((long)&elem2_2.field_0 + 0x40));
  proto2_unittest::TestField::TestField((TestField *)((long)&elem3_2.field_0 + 0x40));
  proto2_unittest::TestField::TestField((TestField *)((long)&diff_report.field_2 + 8));
  proto2_unittest::TestField::set_a((TestField *)((long)&elem2_1.field_0 + 0x40),1);
  proto2_unittest::TestField::set_b((TestField *)((long)&elem2_1.field_0 + 0x40),1);
  proto2_unittest::TestField::set_c((TestField *)((long)&elem2_1.field_0 + 0x40),1);
  proto2_unittest::TestField::set_a((TestField *)((long)&elem3_1.field_0 + 0x40),2);
  proto2_unittest::TestField::set_a((TestField *)((long)&elem3_2.field_0 + 0x40),2);
  proto2_unittest::TestField::set_b((TestField *)((long)&elem3_1.field_0 + 0x40),2);
  proto2_unittest::TestField::set_b((TestField *)((long)&elem3_2.field_0 + 0x40),0);
  proto2_unittest::TestField::set_c((TestField *)((long)&elem3_1.field_0 + 0x40),2);
  proto2_unittest::TestField::set_c((TestField *)((long)&elem3_2.field_0 + 0x40),2);
  proto2_unittest::TestField::set_a((TestField *)((long)&elem2_2.field_0 + 0x40),3);
  proto2_unittest::TestField::set_a((TestField *)((long)&diff_report.field_2 + 8),3);
  proto2_unittest::TestField::set_b((TestField *)((long)&elem2_2.field_0 + 0x40),3);
  proto2_unittest::TestField::set_b((TestField *)((long)&diff_report.field_2 + 8),0);
  proto2_unittest::TestField::set_c((TestField *)((long)&elem2_2.field_0 + 0x40),3);
  proto2_unittest::TestField::set_c((TestField *)((long)&diff_report.field_2 + 8),3);
  pTVar2 = proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestField::operator=(pTVar2,(TestField *)((long)&elem2_1.field_0 + 0x40));
  pTVar2 = proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestField::operator=(pTVar2,(TestField *)((long)&elem3_1.field_0 + 0x40));
  pTVar2 = proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestField::operator=(pTVar2,(TestField *)((long)&elem2_2.field_0 + 0x40));
  pTVar2 = proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)local_180);
  proto2_unittest::TestField::operator=(pTVar2,(TestField *)((long)&elem3_2.field_0 + 0x40));
  pTVar2 = proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)local_180);
  proto2_unittest::TestField::operator=(pTVar2,(TestField *)((long)&diff_report.field_2 + 8));
  std::__cxx11::string::string((string *)&differencer.unpack_any_field_);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)&gtest_ar_.message_);
  util::MessageDifferencer::ReportDifferencesToString
            ((MessageDifferencer *)&gtest_ar_.message_,(string *)&differencer.unpack_any_field_);
  util::MessageDifferencer::set_repeated_field_comparison
            ((MessageDifferencer *)&gtest_ar_.message_,AS_SMART_SET);
  bVar1 = util::MessageDifferencer::Compare
                    ((MessageDifferencer *)&gtest_ar_.message_,
                     (Message *)((long)&msg2.field_0 + 0xa0),(Message *)local_180);
  local_529 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_528,&local_529,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
  if (!bVar1) {
    testing::Message::Message(&local_538);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_528,(AssertionResult *)0x1ebd035,
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x6ce,pcVar3);
    testing::internal::AssertHelper::operator=(&local_540,&local_538);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
  testing::internal::EqHelper::
  Compare<char[110],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_570,
             "\"modified: rm[1].b -> rm[0].b: 2 -> 0\\n\" \"modified: rm[2].b -> rm[1].b: 3 -> 0\\n\" \"deleted: rm[0]: { c: 1 a: 1 b: 1 }\\n\""
             ,"diff_report",
             (char (*) [110])
             "modified: rm[1].b -> rm[0].b: 2 -> 0\nmodified: rm[2].b -> rm[1].b: 3 -> 0\ndeleted: rm[0]: { c: 1 a: 1 b: 1 }\n"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &differencer.unpack_any_field_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
  if (!bVar1) {
    testing::Message::Message(&local_578);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_570);
    testing::internal::AssertHelper::AssertHelper
              (&local_580,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x6d3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_580,&local_578);
    testing::internal::AssertHelper::~AssertHelper(&local_580);
    testing::Message::~Message(&local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)&differencer.unpack_any_field_);
  proto2_unittest::TestField::~TestField((TestField *)((long)&diff_report.field_2 + 8));
  proto2_unittest::TestField::~TestField((TestField *)((long)&elem3_2.field_0 + 0x40));
  proto2_unittest::TestField::~TestField((TestField *)((long)&elem2_2.field_0 + 0x40));
  proto2_unittest::TestField::~TestField((TestField *)((long)&elem3_1.field_0 + 0x40));
  proto2_unittest::TestField::~TestField((TestField *)((long)&elem2_1.field_0 + 0x40));
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_180);
  proto2_unittest::TestDiffMessage::~TestDiffMessage
            ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldSmartSet_MultipleMatches) {
  // Create the testing protos
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  proto2_unittest::TestField elem1_1, elem2_1, elem3_1;
  proto2_unittest::TestField elem2_2, elem3_2;

  // Only one field is different for each pair of elements
  elem1_1.set_a(1);
  elem1_1.set_b(1);
  elem1_1.set_c(1);
  elem2_1.set_a(2);
  elem2_2.set_a(2);
  elem2_1.set_b(2);
  elem2_2.set_b(0);
  elem2_1.set_c(2);
  elem2_2.set_c(2);
  elem3_1.set_a(3);
  elem3_2.set_a(3);
  elem3_1.set_b(3);
  elem3_2.set_b(0);
  elem3_1.set_c(3);
  elem3_2.set_c(3);

  // In this testcase, elem1_1 will match with elem2_2 first and then get
  // reverted because elem2_1 matches with elem2_2 later.
  *msg1.add_rm() = elem1_1;
  *msg1.add_rm() = elem2_1;
  *msg1.add_rm() = elem3_1;
  *msg2.add_rm() = elem2_2;
  *msg2.add_rm() = elem3_2;

  std::string diff_report;
  util::MessageDifferencer differencer;
  differencer.ReportDifferencesToString(&diff_report);
  differencer.set_repeated_field_comparison(
      util::MessageDifferencer::AS_SMART_SET);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "modified: rm[1].b -> rm[0].b: 2 -> 0\n"
      "modified: rm[2].b -> rm[1].b: 3 -> 0\n"
      "deleted: rm[0]: { c: 1 a: 1 b: 1 }\n",
      diff_report);
}